

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

int tinyusdz::USDZSizeAsset(char *resolved_asset_name,uint64_t *nbytes,string *err,void *userdata)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *this;
  uint64_t *puVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  allocator local_f9;
  string local_f8 [32];
  unsigned_long local_d8;
  pair<unsigned_long,_unsigned_long> byte_range;
  string local_c0 [32];
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [39];
  allocator local_59;
  string local_58 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_38;
  USDZAsset *passet;
  void *userdata_local;
  string *err_local;
  uint64_t *nbytes_local;
  char *resolved_asset_name_local;
  
  passet = (USDZAsset *)userdata;
  userdata_local = err;
  err_local = (string *)nbytes;
  nbytes_local = (uint64_t *)resolved_asset_name;
  if (userdata == (void *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`userdata` must be non-null.\n");
    }
    resolved_asset_name_local._4_4_ = -2;
  }
  else if (resolved_asset_name == (char *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`resolved_asset_name` must be non-null.\n");
    }
    resolved_asset_name_local._4_4_ = -2;
  }
  else if (nbytes == (uint64_t *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`nbytes` must be non-null.\n");
    }
    resolved_asset_name_local._4_4_ = -2;
  }
  else {
    local_38 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                *)userdata;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,resolved_asset_name,&local_59);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     *)userdata,(key_type *)local_58);
    ::std::__cxx11::string::~string(local_58);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    puVar1 = nbytes_local;
    this = local_38;
    if (sVar2 == 0) {
      if (userdata_local != (void *)0x0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_c0,(char *)puVar1,(allocator *)((long)&byte_range.second + 7));
        ::std::operator+((char *)local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "resolved_asset_name `");
        ::std::operator+(local_80,(char *)local_a0);
        ::std::__cxx11::string::operator+=((string *)userdata_local,(string *)local_80);
        ::std::__cxx11::string::~string((string *)local_80);
        ::std::__cxx11::string::~string(local_a0);
        ::std::__cxx11::string::~string(local_c0);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&byte_range.second + 7));
      }
      resolved_asset_name_local._4_4_ = -1;
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f8,(char *)puVar1,&local_f9);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::at(this,(key_type *)local_f8);
      local_d8 = pmVar3->first;
      byte_range.first = pmVar3->second;
      ::std::__cxx11::string::~string(local_f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      if (local_d8 < byte_range.first) {
        *(unsigned_long *)err_local = byte_range.first - local_d8;
        resolved_asset_name_local._4_4_ = 0;
      }
      else {
        if (userdata_local != (void *)0x0) {
          ::std::__cxx11::string::operator+=
                    ((string *)userdata_local,"Invalid USDZAsset byte range.\n");
        }
        resolved_asset_name_local._4_4_ = -2;
      }
    }
  }
  return resolved_asset_name_local._4_4_;
}

Assistant:

int USDZSizeAsset(const char *resolved_asset_name, uint64_t *nbytes, std::string *err, void *userdata) {

  if (!userdata) {
    if (err) {
      (*err) += "`userdata` must be non-null.\n";
    }
    return -2;
  }

  if (!resolved_asset_name) {
    if (err) {
      (*err) += "`resolved_asset_name` must be non-null.\n";
    }
    return -2;
  }

  if (!nbytes) {
    if (err) {
      (*err) += "`nbytes` must be non-null.\n";
    }
    return -2;
  }

  const USDZAsset *passet = reinterpret_cast<const USDZAsset *>(userdata);

  if (!passet->asset_map.count(resolved_asset_name)) {
    if (err) {
      (*err) += "resolved_asset_name `" + std::string(resolved_asset_name) + "` not found in USDZAsset.\n";
    }
    return -1;
  }

  std::pair<size_t, size_t> byte_range = passet->asset_map.at(resolved_asset_name);

  if (byte_range.first >= byte_range.second) {
    if (err) {
      (*err) += "Invalid USDZAsset byte range.\n";
    }
    return -2;
  }

  (*nbytes) = byte_range.second - byte_range.first;

  return 0;
}